

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O0

void __thiscall audiofft::OouraFFT::fft(OouraFFT *this,float *data,float *re,float *im)

{
  size_t sVar1;
  double *pdVar2;
  int *ip;
  double *pdVar3;
  ulong uVar4;
  size_t size2;
  float *i;
  float *r;
  double *bEnd;
  double *b;
  float *im_local;
  float *re_local;
  float *data_local;
  OouraFFT *this_local;
  
  pdVar2 = std::vector<double,_std::allocator<double>_>::data(&this->_buffer);
  detail::ConvertBuffer<double,float>(pdVar2,data,this->_size);
  sVar1 = this->_size;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data(&this->_buffer);
  ip = std::vector<int,_std::allocator<int>_>::data(&this->_ip);
  pdVar3 = std::vector<double,_std::allocator<double>_>::data(&this->_w);
  rdft(this,(int)sVar1,1,pdVar2,ip,pdVar3);
  bEnd = std::vector<double,_std::allocator<double>_>::data(&this->_buffer);
  pdVar2 = bEnd + this->_size;
  size2 = (size_t)im;
  i = re;
  while (bEnd != pdVar2) {
    pdVar3 = bEnd + 1;
    *i = (float)*bEnd;
    bEnd = bEnd + 2;
    *(float *)size2 = (float)-*pdVar3;
    size2 = size2 + 4;
    i = i + 1;
  }
  uVar4 = this->_size >> 1;
  re[uVar4] = -*im;
  *im = 0.0;
  im[uVar4] = 0.0;
  return;
}

Assistant:

virtual void fft(const float* data, float* re, float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          detail::ConvertBuffer(_buffer.data(), data, _size);

          rdft(static_cast<int>(_size), +1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            float *r = re;
            float *i = im;
            while (b != bEnd)
            {
              *(r++) = static_cast<float>(*(b++));
              *(i++) = static_cast<float>(-(*(b++)));
            }
          }
          const size_t size2 = _size / 2;
          re[size2] = -im[0];
          im[0] = 0.0;
          im[size2] = 0.0;
        }